

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table.cpp
# Opt level: O0

void __thiscall Table::dbOpen(Table *this,string *filename)

{
  Pager *this_00;
  uint32_t uVar1;
  char *node;
  char *rootNode;
  string local_38;
  string *local_18;
  string *filename_local;
  Table *this_local;
  
  this_00 = this->pager;
  local_18 = filename;
  filename_local = (string *)this;
  std::__cxx11::string::string((string *)&local_38,(string *)filename);
  Pager::_open(this_00,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  this->rootPageNum = 0;
  uVar1 = Pager::getNumOfPages(this->pager);
  if (uVar1 == 0) {
    node = Pager::getPage(this->pager,0);
    initialize_leaf_node(node);
    set_node_root(node,true);
  }
  return;
}

Assistant:

void Table::dbOpen(std::string filename) {
    pager->_open(filename);
    rootPageNum = 0;
    if (pager->getNumOfPages() == 0) {
        char *rootNode = pager->getPage(0);
        initialize_leaf_node(rootNode);
		set_node_root(rootNode, true);
    }
}